

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_examples.cpp
# Opt level: O1

TRIPLEYCbCr **
gradationalTransformation(TRIPLEYCbCr **mrx,BITMAPFILEHEADER bmFile,BITMAPINFOHEADER bmInfo)

{
  int *piVar1;
  TRIPLEYCbCr *pTVar2;
  undefined1 auVar3 [16];
  int i;
  void *__s;
  void *pvVar4;
  TRIPLEYCbCr **ppTVar5;
  TRIPLEYCbCr *pTVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  
  __s = operator_new__(0x400);
  lVar11 = (long)(int)bmInfo.biHeight;
  memset(__s,0,0x400);
  if (0 < lVar11) {
    lVar7 = 0;
    do {
      if (0 < (int)bmInfo.biWidth) {
        pTVar6 = mrx[lVar7];
        lVar9 = 0;
        do {
          piVar1 = (int *)((long)__s + (ulong)(&pTVar6->Y)[lVar9] * 4);
          *piVar1 = *piVar1 + 1;
          lVar9 = lVar9 + 3;
        } while ((ulong)bmInfo.biWidth * 3 != lVar9);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar11);
  }
  pvVar4 = operator_new__(0x100);
  lVar7 = 0;
  do {
    if (lVar7 == 0) {
      dVar12 = 0.0;
    }
    else {
      lVar9 = 0;
      iVar8 = 0;
      do {
        iVar8 = iVar8 + *(int *)((long)__s + lVar9 * 4);
        lVar9 = lVar9 + 1;
      } while (lVar7 != lVar9);
      dVar12 = (double)iVar8;
    }
    *(char *)((long)pvVar4 + lVar7) =
         (char)(int)(dVar12 * (255.0 / (double)(int)(bmInfo.biHeight * bmInfo.biWidth)));
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x100);
  uVar10 = lVar11 << 3;
  if ((int)bmInfo.biHeight < 0) {
    uVar10 = 0xffffffffffffffff;
  }
  ppTVar5 = (TRIPLEYCbCr **)operator_new__(uVar10);
  if (0 < (int)bmInfo.biHeight) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)(int)bmInfo.biWidth;
    uVar10 = SUB168(auVar3 * ZEXT816(3),0);
    if (SUB168(auVar3 * ZEXT816(3),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    lVar7 = 0;
    do {
      pTVar6 = (TRIPLEYCbCr *)operator_new__(uVar10);
      ppTVar5[lVar7] = pTVar6;
      if (0 < (int)bmInfo.biWidth) {
        pTVar2 = mrx[lVar7];
        lVar9 = 0;
        do {
          (&pTVar6->Y)[lVar9] = *(uchar *)((long)pvVar4 + (ulong)(&pTVar2->Y)[lVar9]);
          lVar9 = lVar9 + 3;
        } while ((ulong)bmInfo.biWidth * 3 != lVar9);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar11);
  }
  return ppTVar5;
}

Assistant:

TRIPLEYCbCr **gradationalTransformation(TRIPLEYCbCr **mrx, BITMAPFILEHEADER bmFile, BITMAPINFOHEADER bmInfo) {
    int *n = new int[256];
    int h = bmInfo.biHeight;
    int w = bmInfo.biWidth;
    memset(n, 0, sizeof(int) * 256);
    for (int i = 0; i < h; i++) {
        for (int j = 0; j < w; j++) {
            n[mrx[i][j].Y]++;
        }
    }

    uint8_t *s = new uint8_t[256];
    for (int i = 0; i < 256; i++) {
        int sum = 0;
        for (int j = 0; j < i; j++) {
            sum += n[j];
        }
        s[i] = (uint8_t) (sum * ((double) 255 / (h * w)));
    }
    TRIPLEYCbCr **mrxGrad = new TRIPLEYCbCr *[h];
    for (int i = 0; i < h; i++) {
        mrxGrad[i] = new TRIPLEYCbCr[w];
        for (int j = 0; j < w; j++) {
            mrxGrad[i][j].Y = s[mrx[i][j].Y];
        }
    }
    return mrxGrad;
}